

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

bool Js::JavascriptOperators::ShouldTryDeleteProperty
               (RecyclableObject *instance,JavascriptString *propertyNameString,
               PropertyRecord **pPropertyRecord)

{
  ScriptContext *this;
  bool bVar1;
  PropertyRecord *local_28;
  PropertyRecord *propertyRecord;
  
  local_28 = (PropertyRecord *)0x0;
  bVar1 = CanShortcutOnUnknownPropertyName(instance);
  this = (((((instance->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
         scriptContext.ptr;
  if (bVar1) {
    ScriptContext::FindPropertyRecord(this,propertyNameString,&local_28);
  }
  else {
    ScriptContext::GetOrAddPropertyRecord(this,propertyNameString,&local_28);
  }
  if (local_28 != (PropertyRecord *)0x0) {
    *pPropertyRecord = local_28;
  }
  return local_28 != (PropertyRecord *)0x0;
}

Assistant:

bool JavascriptOperators::ShouldTryDeleteProperty(RecyclableObject* instance, JavascriptString *propertyNameString, PropertyRecord const **pPropertyRecord)
    {
        PropertyRecord const *propertyRecord = nullptr;
        if (!JavascriptOperators::CanShortcutOnUnknownPropertyName(instance))
        {
            instance->GetScriptContext()->GetOrAddPropertyRecord(propertyNameString, &propertyRecord);
        }
        else
        {
            instance->GetScriptContext()->FindPropertyRecord(propertyNameString, &propertyRecord);
        }

        if (propertyRecord == nullptr)
        {
            return false;
        }
        *pPropertyRecord = propertyRecord;
        return true;
    }